

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitTypedArrayIndex
          (AsmJSByteCodeGenerator *this,ParseNode *indexNode,OpCodeAsmJs *op,uint32 *indexSlot,
          ViewType viewType,TypedArrayEmitType emitType)

{
  AsmJsModuleCompiler *pAVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  IdentPtr pIVar6;
  AsmJsSymbol *sym;
  ParseNodeInt *pPVar7;
  ParseNodeFloat *pPVar8;
  char16 *pcVar9;
  AsmJsCompilationException *pAVar10;
  undefined4 *puVar11;
  AsmJsVarType local_99;
  AsmJsVar *local_98;
  AsmJsVar *definition_1;
  AsmJsSymbol *declSym_1;
  ParseNode *rhsNode;
  ParseNode *index;
  uint local_70;
  uint32 mask;
  int val;
  EmitExpressionInfo local_5c;
  EmitExpressionInfo indexInfo;
  AsmJsVar *definition;
  AsmJsSymbol *declSym;
  uint32 slot;
  bool isConst;
  TypedArrayEmitType emitType_local;
  ViewType viewType_local;
  uint32 *indexSlot_local;
  OpCodeAsmJs *op_local;
  ParseNode *indexNode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo indexInfo_1;
  
  AsmJsModuleCompiler::SetUsesHeapBuffer(this->mCompiler,true);
  declSym._7_1_ = false;
  declSym._0_4_ = 0;
  if (indexNode->nop == knopName) {
    pAVar1 = this->mCompiler;
    pIVar6 = ParseNode::name(indexNode);
    sym = AsmJsModuleCompiler::LookupIdentifier(pAVar1,pIVar6,this->mFunction,(Source *)0x0);
    bVar3 = AsmJsVar::Is(sym);
    if ((bVar3) && (uVar4 = (*sym->_vptr_AsmJsSymbol[1])(), (uVar4 & 1) == 0)) {
      register0x00000000 = AsmJsVar::FromSymbol(sym);
      indexInfo.super_EmitInfoBase.location._3_1_ =
           AsmJsVarBase::GetVarType(&register0x00000000->super_AsmJsVarBase);
      declSym._7_1_ =
           AsmJsVarType::isInt((AsmJsVarType *)((long)&indexInfo.super_EmitInfoBase.location + 3));
      if (declSym._7_1_) {
        declSym._0_4_ = AsmJsVar::GetIntInitialiser(stack0xffffffffffffffb0);
      }
    }
  }
  if (((indexNode->nop == knopInt) || (indexNode->nop == knopFlt)) || (declSym._7_1_ != false)) {
    if (declSym._7_1_ == false) {
      if (indexNode->nop == knopInt) {
        pPVar7 = ParseNode::AsParseNodeInt(indexNode);
        declSym._0_4_ = pPVar7->lw;
      }
      else {
        bVar3 = ParserWrapper::IsMinInt(indexNode);
        if (bVar3) {
          declSym._0_4_ = 0x80000000;
        }
        else {
          bVar3 = ParserWrapper::IsUnsigned(indexNode);
          if (!bVar3) {
            local_5c = Emit(this,indexNode);
            pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            pcVar9 = AsmJsType::toChars(&local_5c.type);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar10,L"Array Index must be intish; %s given",pcVar9);
            __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
          }
          pPVar8 = ParseNode::AsParseNodeFloat(indexNode);
          declSym._0_4_ = (uint)(long)pPVar8->dbl;
        }
      }
    }
    uVar4 = (uint)viewType;
    if (uVar4 - 2 < 2) {
      if (((uint)declSym & 0x80000000) != 0) {
        pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar10,L"Numeric literal for heap16 must be within 0 <= n < 2^31; %d given",
                   (ulong)(uint)declSym);
        __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
      }
      declSym._0_4_ = (uint)declSym << 1;
    }
    else if (uVar4 - 4 < 3) {
      if (((uint)declSym & 0xc0000000) != 0) {
        pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar10,L"Numeric literal for heap32 must be within 0 <= n < 2^30; %d given",
                   (ulong)(uint)declSym);
        __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
      }
      declSym._0_4_ = (uint)declSym << 2;
    }
    else if (uVar4 == 7) {
      if (((uint)declSym & 0xe0000000) != 0) {
        pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar10,L"Numeric literal for heap64 must be within 0 <= n < 2^29; %d given",
                   (ulong)(uint)declSym);
        __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
      }
      declSym._0_4_ = (uint)declSym << 3;
    }
    AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,(uint)declSym);
    *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)emitType * 4);
  }
  else {
    EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local);
    if (((indexNode->nop != knopRsh) && (viewType != TYPE_INT8)) && (viewType != TYPE_UINT8)) {
      pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar10,L"index expression isn\'t shifted; must be an Int8/Uint8 access");
      __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
    }
    local_70 = 0;
    index._4_4_ = 0xffffffff;
    rhsNode = indexNode;
    if (indexNode->nop == knopRsh) {
      declSym_1 = (AsmJsSymbol *)ParserWrapper::GetBinaryRight(indexNode);
      if ((declSym_1 == (AsmJsSymbol *)0x0) || (*(OpCode *)&declSym_1->_vptr_AsmJsSymbol != knopInt)
         ) {
        pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar10,L"shift amount must be constant");
        __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
      }
      switch(viewType) {
      case TYPE_INT8:
        local_70 = 0;
        index._4_4_ = 0xffffffff;
        break;
      case TYPE_UINT8:
        local_70 = 0;
        index._4_4_ = 0xffffffff;
        break;
      case TYPE_INT16:
        local_70 = 1;
        index._4_4_ = 0xfffffffe;
        break;
      case TYPE_UINT16:
        local_70 = 1;
        index._4_4_ = 0xfffffffe;
        break;
      case TYPE_INT32:
        local_70 = 2;
        index._4_4_ = 0xfffffffc;
        break;
      case TYPE_UINT32:
        local_70 = 2;
        index._4_4_ = 0xfffffffc;
        break;
      case TYPE_FLOAT32:
        local_70 = 2;
        index._4_4_ = 0xfffffffc;
        break;
      case TYPE_FLOAT64:
        local_70 = 3;
        index._4_4_ = 0xfffffff8;
        break;
      case TYPE_INT64:
        local_70 = 3;
        index._4_4_ = 0xfffffff8;
        break;
      case TYPE_INT8_TO_INT64:
        local_70 = 0;
        index._4_4_ = 0xffffffff;
        break;
      case TYPE_UINT8_TO_INT64:
        local_70 = 0;
        index._4_4_ = 0xffffffff;
        break;
      case TYPE_INT16_TO_INT64:
        local_70 = 1;
        index._4_4_ = 0xfffffffe;
        break;
      case TYPE_UINT16_TO_INT64:
        local_70 = 1;
        index._4_4_ = 0xfffffffe;
        break;
      case TYPE_INT32_TO_INT64:
        local_70 = 2;
        index._4_4_ = 0xfffffffc;
        break;
      case TYPE_UINT32_TO_INT64:
        local_70 = 2;
        index._4_4_ = 0xfffffffc;
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x63e,"((0))","(0)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pPVar7 = ParseNode::AsParseNodeInt((ParseNode *)declSym_1);
      if (pPVar7->lw != local_70) {
        pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar10,L"shift amount must be %d",(ulong)local_70);
        __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
      }
      rhsNode = ParserWrapper::GetBinaryLeft(indexNode);
    }
    declSym._7_1_ = false;
    if (rhsNode->nop == knopName) {
      pAVar1 = this->mCompiler;
      pIVar6 = ParseNode::name(rhsNode);
      definition_1 = (AsmJsVar *)
                     AsmJsModuleCompiler::LookupIdentifier
                               (pAVar1,pIVar6,this->mFunction,(Source *)0x0);
      bVar3 = AsmJsVar::Is((AsmJsSymbol *)definition_1);
      if ((bVar3) &&
         (uVar4 = (*(definition_1->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(),
         (uVar4 & 1) == 0)) {
        local_98 = AsmJsVar::FromSymbol((AsmJsSymbol *)definition_1);
        local_99 = AsmJsVarBase::GetVarType(&local_98->super_AsmJsVarBase);
        declSym._7_1_ = AsmJsVarType::isInt(&local_99);
        if (declSym._7_1_) {
          uVar4 = AsmJsVar::GetIntInitialiser(local_98);
          declSym._0_4_ = index._4_4_ & uVar4;
          *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)emitType * 4);
          AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,(uint)declSym);
        }
      }
    }
    bVar3 = ParserWrapper::IsUInt(rhsNode);
    if (bVar3) {
      uVar5 = ParserWrapper::GetUInt(rhsNode);
      declSym._0_4_ = index._4_4_ & uVar5;
      *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)emitType * 4);
      AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,(uint)declSym);
    }
    else if (declSym._7_1_ == false) {
      this_local = (AsmJSByteCodeGenerator *)Emit(this,rhsNode);
      bVar3 = AsmJsType::isIntish((AsmJsType *)((long)&this_local + 4));
      if (bVar3) {
        *indexSlot = (uint32)this_local;
        *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)emitType * 4 + 2);
        return (EmitExpressionInfo)this_local;
      }
      pAVar10 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      pcVar9 = AsmJsType::toChars((AsmJsType *)((long)&this_local + 4));
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar10,L"Left operand of >> must be intish; %s given",pcVar9);
      __cxa_throw(pAVar10,&AsmJsCompilationException::typeinfo,0);
    }
  }
  *indexSlot = (uint)declSym;
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local);
  return (EmitExpressionInfo)this_local;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitTypedArrayIndex(ParseNode* indexNode, OpCodeAsmJs &op, uint32 &indexSlot, ArrayBufferView::ViewType viewType, TypedArrayEmitType emitType)
    {
        mCompiler->SetUsesHeapBuffer(true);
        bool isConst = false;
        uint32 slot = 0;
        if(indexNode->nop == knopName)
        {
            AsmJsSymbol * declSym = mCompiler->LookupIdentifier(indexNode->name(), mFunction);
            if (AsmJsVar::Is(declSym) && !declSym->isMutable())
            {
                AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                if(definition->GetVarType().isInt())
                {
                    slot = (uint32)definition->GetIntInitialiser();
                    isConst = true;
                }
            }
        }
        if (indexNode->nop == knopInt || indexNode->nop == knopFlt || isConst)
        {
            // Emit a different opcode for numerical literal
            if (!isConst)
            {
                if (indexNode->nop == knopInt)
                {
                    slot = (uint32)indexNode->AsParseNodeInt()->lw;
                }
                else if (ParserWrapper::IsMinInt(indexNode))
                {
                    // this is going to be an error, but we can do this to allow it to get same error message as invalid int
                    slot = (uint32)INT32_MIN;
                }
                else if (ParserWrapper::IsUnsigned(indexNode))
                {
                    slot = (uint32)indexNode->AsParseNodeFloat()->dbl;
                }
                else
                {
                    EmitExpressionInfo indexInfo = Emit(indexNode);
                    throw AsmJsCompilationException(_u("Array Index must be intish; %s given"), indexInfo.type.toChars());
                }
            }
            // do the right shift now
            switch( viewType )
            {
            case Js::ArrayBufferView::TYPE_INT16:
            case Js::ArrayBufferView::TYPE_UINT16:
                if (slot & 0x80000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap16 must be within 0 <= n < 2^31; %d given"), slot);
                }
                slot <<= 1;
                break;
            case Js::ArrayBufferView::TYPE_INT32:
            case Js::ArrayBufferView::TYPE_UINT32:
            case Js::ArrayBufferView::TYPE_FLOAT32:
                if (slot & 0xC0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap32 must be within 0 <= n < 2^30; %d given"), slot);
                }
                slot <<= 2;
                break;
            case Js::ArrayBufferView::TYPE_FLOAT64:
                if (slot & 0xE0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap64 must be within 0 <= n < 2^29; %d given"), slot);
                }
                slot <<= 3;
                break;
            default:
                break;
            }
            mCompiler->UpdateMaxHeapAccess(slot);
            op = typedArrayOp[emitType][0];
        }
        else
        {
            EmitExpressionInfo indexInfo;
            if (indexNode->nop != knopRsh && viewType != Js::ArrayBufferView::TYPE_INT8 && viewType != Js::ArrayBufferView::TYPE_UINT8)
            {
                throw AsmJsCompilationException( _u("index expression isn't shifted; must be an Int8/Uint8 access") );
            }
            int val = 0;
            uint32 mask = (uint32)~0;
            ParseNode* index;
            if (indexNode->nop == knopRsh)
            {
                ParseNode* rhsNode = ParserWrapper::GetBinaryRight(indexNode);
                if (!rhsNode || rhsNode->nop != knopInt)
                {
                    throw AsmJsCompilationException(_u("shift amount must be constant"));
                }
                switch (viewType)
                {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
                case Js::ArrayBufferView::TYPE_##name:\
                    val = align;\
                    mask = ARRAYBUFFER_VIEW_MASK(align);\
                    break;
                #include "AsmJsArrayBufferViews.h"
                default:
                    Assume(UNREACHED);
                }
                if (rhsNode->AsParseNodeInt()->lw != val)
                {
                    throw AsmJsCompilationException(_u("shift amount must be %d"), val);
                }
                index = ParserWrapper::GetBinaryLeft(indexNode);
            }
            else
            {
                index = indexNode;
            }

            isConst = false;
            if (index->nop == knopName)
            {
                AsmJsSymbol * declSym = mCompiler->LookupIdentifier(index->name(), mFunction);
                if (AsmJsVar::Is(declSym) && !declSym->isMutable())
                {
                    AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                    if (definition->GetVarType().isInt())
                    {
                        slot = (uint32)definition->GetIntInitialiser();
                        slot &= mask;
                        op = typedArrayOp[emitType][0];
                        isConst = true;
                        mCompiler->UpdateMaxHeapAccess(slot);
                    }
                }
            }
            if( ParserWrapper::IsUInt( index) )
            {
                slot = ParserWrapper::GetUInt(index);
                slot &= mask;
                op = typedArrayOp[emitType][0];

                mCompiler->UpdateMaxHeapAccess(slot);
            }
            else if (!isConst)
            {
                indexInfo = Emit( index );
                if( !indexInfo.type.isIntish() )
                {
                    throw AsmJsCompilationException( _u("Left operand of >> must be intish; %s given"), indexInfo.type.toChars() );
                }
                indexSlot = indexInfo.location;
                op = typedArrayOp[emitType][1];
                return indexInfo;
            }
        }
        indexSlot = slot;
        return EmitExpressionInfo();
    }